

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triplets.cpp
# Opt level: O1

void __thiscall
iDynTree::Triplets::addDiagonalMatrix
          (Triplets *this,size_t startingRow,size_t startingColumn,double value,
          size_t diagonalMatrixSize)

{
  pointer *ppTVar1;
  iterator __position;
  Triplet local_40;
  
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve
            (&this->m_triplets,
             ((long)(this->m_triplets).
                    super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_triplets).
                    super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
             diagonalMatrixSize);
  if (diagonalMatrixSize != 0) {
    do {
      Triplet::Triplet(&local_40,startingRow,startingColumn,value);
      __position._M_current =
           (this->m_triplets).
           super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_triplets).
          super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::
        _M_realloc_insert<iDynTree::Triplet>(&this->m_triplets,__position,&local_40);
      }
      else {
        (__position._M_current)->value = local_40.value;
        (__position._M_current)->row = local_40.row;
        (__position._M_current)->column = local_40.column;
        ppTVar1 = &(this->m_triplets).
                   super__Vector_base<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>._M_impl
                   .super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      startingColumn = startingColumn + 1;
      startingRow = startingRow + 1;
      diagonalMatrixSize = diagonalMatrixSize - 1;
    } while (diagonalMatrixSize != 0);
  }
  return;
}

Assistant:

void Triplets::addDiagonalMatrix(std::size_t startingRow,
                                     std::size_t startingColumn,
                                     double value,
                                     std::size_t diagonalMatrixSize)
    {
        //if enough memory has been reserved this should be a noop
        m_triplets.reserve(m_triplets.size() + diagonalMatrixSize);
        for (std::size_t i = 0; i < diagonalMatrixSize; ++i) {
            m_triplets.push_back(Triplet(startingRow + i, startingColumn + i, value));
        }
    }